

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_gfx.h
# Opt level: O0

void sg_init_pass(sg_pass pass_id,sg_pass_desc *desc)

{
  _sg_pass_t *pass_00;
  _sg_pass_t *pass;
  sg_pass_desc desc_def;
  sg_pass_desc *desc_local;
  sg_pass pass_id_local;
  
  desc_def._72_8_ = desc;
  if (!_sg.valid) {
    __assert_fail("_sg.valid",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                  ,0x3e36,"void sg_init_pass(sg_pass, const sg_pass_desc *)");
  }
  _sg_pass_desc_defaults((sg_pass_desc *)&pass,desc);
  pass_00 = _sg_lookup_pass(&_sg.pools,pass_id.id);
  if (pass_00 != (_sg_pass_t *)0x0) {
    if ((pass_00->slot).state == SG_RESOURCESTATE_ALLOC) {
      _sg_init_pass(pass_00,(sg_pass_desc *)&pass);
      if (((pass_00->slot).state != SG_RESOURCESTATE_VALID) &&
         ((pass_00->slot).state != SG_RESOURCESTATE_FAILED)) {
        __assert_fail("(pass->slot.state == SG_RESOURCESTATE_VALID) || (pass->slot.state == SG_RESOURCESTATE_FAILED)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/sokol-src/sokol_gfx.h"
                      ,0x3e3c,"void sg_init_pass(sg_pass, const sg_pass_desc *)");
      }
    }
    else {
      _sg_log("sg_init_pass: pass must be in alloc state\n");
    }
  }
  return;
}

Assistant:

inline void sg_init_pass(sg_pass pass_id, const sg_pass_desc& desc) { return sg_init_pass(pass_id, &desc); }